

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O1

IntrinsicResult intrinsic_fwrite(Context *context,IntrinsicResult partialResult)

{
  ListStorage<MiniScript::TACLine> *pLVar1;
  long *plVar2;
  undefined4 *puVar3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  size_t sVar6;
  char *__ptr;
  Value fileWrapper;
  String data;
  Value self;
  Value local_b0;
  ValueType local_a0;
  undefined2 local_9f;
  anon_union_8_3_2f476f46_for_data local_98;
  Value local_90;
  _func_int **local_80;
  anon_union_8_3_2f476f46_for_data local_78;
  long *local_70;
  anon_union_8_3_2f476f46_for_data local_68;
  long *local_60;
  anon_union_8_3_2f476f46_for_data local_58;
  undefined1 local_50 [16];
  Value local_40 [2];
  
  local_58.tempNum._0_1_ = '\0';
  plVar2 = (long *)operator_new(0x30);
  plVar2[1] = 1;
  *plVar2 = (long)&PTR__StringStorage_001d10b0;
  plVar2[3] = 5;
  plVar2[4] = -1;
  puVar3 = (undefined4 *)operator_new__(5);
  plVar2[2] = (long)puVar3;
  *(undefined1 *)(puVar3 + 1) = 0;
  *puVar3 = 0x666c6573;
  local_60 = plVar2;
  MiniScript::Context::GetVar
            ((Context *)local_50,(String *)partialResult.rs,(LocalOnlyMode)&local_60);
  if ((local_60 != (long *)0x0) && (local_58.tempNum._0_1_ == '\0')) {
    plVar2 = local_60 + 1;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (**(code **)(*local_60 + 8))();
    }
    local_60 = (long *)0x0;
  }
  local_78.tempNum._0_1_ = '\0';
  pp_Var4 = (_func_int **)operator_new(0x30);
  pp_Var4[1] = (_func_int *)0x1;
  *pp_Var4 = (_func_int *)&PTR__StringStorage_001d10b0;
  pp_Var4[3] = (_func_int *)0x5;
  pp_Var4[4] = (_func_int *)0xffffffffffffffff;
  p_Var5 = (_func_int *)operator_new__(5);
  pp_Var4[2] = p_Var5;
  p_Var5[4] = (code)0x0;
  *(undefined4 *)p_Var5 = 0x61746164;
  local_80 = pp_Var4;
  MiniScript::Context::GetVar
            ((Context *)&local_b0,(String *)partialResult.rs,(LocalOnlyMode)&local_80);
  MiniScript::Value::ToString((Value *)&local_70,(Machine *)&local_b0);
  if ((Temp < local_b0.type) && (local_b0.data.ref != (RefCountedStorage *)0x0)) {
    plVar2 = &(local_b0.data.ref)->refCount;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*(local_b0.data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_b0.data.number = 0.0;
  }
  if ((local_80 != (_func_int **)0x0) && (local_78.tempNum._0_1_ == '\0')) {
    pp_Var4 = local_80 + 1;
    *pp_Var4 = *pp_Var4 + -1;
    if (*pp_Var4 == (_func_int *)0x0) {
      (**(code **)(*local_80 + 8))();
    }
    local_80 = (_func_int **)0x0;
  }
  local_a0 = _handle.type;
  local_9f._0_1_ = _handle.noInvoke;
  local_9f._1_1_ = _handle.localOnly;
  local_98 = _handle.data;
  if ((Temp < _handle.type) && (_handle.data.ref != (RefCountedStorage *)0x0)) {
    (_handle.data.ref)->refCount = (_handle.data.ref)->refCount + 1;
  }
  MiniScript::Value::Lookup(&local_b0,(Value *)local_50);
  if ((Temp < local_a0) && (local_98.ref != (RefCountedStorage *)0x0)) {
    plVar2 = &(local_98.ref)->refCount;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*(local_98.ref)->_vptr_RefCountedStorage[1])();
    }
    local_98.number = 0.0;
  }
  if (local_b0.type == Handle) {
    if ((FILE *)local_b0.data.ref[1]._vptr_RefCountedStorage == (FILE *)0x0) {
      local_90.type = MiniScript::Value::zero;
      local_90.noInvoke = DAT_001d32e1;
      local_90.localOnly = DAT_001d32e2;
      local_90.data.ref = DAT_001d32e8;
      if ((Temp < MiniScript::Value::zero) && (DAT_001d32e8 != (RefCountedStorage *)0x0)) {
        DAT_001d32e8->refCount = DAT_001d32e8->refCount + 1;
      }
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      MiniScript::Value::operator=
                ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                 &local_90);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           1;
      if ((Temp < local_90.type) && (local_90.data.ref != (RefCountedStorage *)0x0)) {
        plVar2 = &(local_90.data.ref)->refCount;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (*(local_90.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_90.data.number = 0.0;
      }
    }
    else {
      if (local_70 == (long *)0x0) {
        __ptr = "";
        sVar6 = 0;
      }
      else {
        __ptr = (char *)local_70[2];
        sVar6 = local_70[3] - 1;
      }
      sVar6 = fwrite(__ptr,1,sVar6,(FILE *)local_b0.data.ref[1]._vptr_RefCountedStorage);
      local_40[0].data.number = (double)(int)sVar6;
      local_40[0].type = Number;
      local_40[0].noInvoke = false;
      local_40[0].localOnly = Off;
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      MiniScript::Value::operator=
                ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                 local_40);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           1;
      if ((Temp < local_40[0].type) &&
         ((IntrinsicResultStorage *)local_40[0].data.ref != (IntrinsicResultStorage *)0x0)) {
        plVar2 = &(local_40[0].data.ref)->refCount;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (*((RefCountedStorage *)&(local_40[0].data.ref)->_vptr_RefCountedStorage)->
            _vptr_RefCountedStorage[1])();
        }
        local_40[0].data.number = 0.0;
      }
    }
  }
  else {
    MiniScript::IntrinsicResult::ensureStorage
              ((IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
    pLVar1 = MiniScript::IntrinsicResult::Null;
    (context->code).ls = MiniScript::IntrinsicResult::Null;
    if (pLVar1 != (ListStorage<MiniScript::TACLine> *)0x0) {
      plVar2 = &(pLVar1->super_RefCountedStorage).refCount;
      *plVar2 = *plVar2 + 1;
    }
  }
  if ((Temp < local_b0.type) && (local_b0.data.ref != (RefCountedStorage *)0x0)) {
    plVar2 = &(local_b0.data.ref)->refCount;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*(local_b0.data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_b0.data.number = 0.0;
  }
  if ((local_70 != (long *)0x0) && (local_68.tempNum._0_1_ == '\0')) {
    plVar2 = local_70 + 1;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (**(code **)(*local_70 + 8))();
    }
    local_70 = (long *)0x0;
  }
  if ((Temp < local_50[0]) && ((RefCountedStorage *)local_50._8_8_ != (RefCountedStorage *)0x0)) {
    plVar2 = (long *)(local_50._8_8_ + 8);
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*(*(_func_int ***)local_50._8_8_)[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_fwrite(Context *context, IntrinsicResult partialResult) {
	Value self = context->GetVar("self");
	String data = context->GetVar("data").ToString();

	Value fileWrapper = self.Lookup(_handle);
	if (fileWrapper.IsNull() or fileWrapper.type != ValueType::Handle) return IntrinsicResult::Null;
	FileHandleStorage *storage = (FileHandleStorage*)fileWrapper.data.ref;
	FILE *handle = storage->f;
	if (handle == nullptr) return IntrinsicResult(Value::zero);

	size_t written = fwrite(data.c_str(), 1, data.sizeB(), handle);
	return IntrinsicResult((int)written);
}